

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.c
# Opt level: O1

int kwsysSystem__AppendArgument
              (char **local,char ***begin,char ***end,int *size,char *arg_local,char **arg_begin,
              char **arg_end,int *arg_size)

{
  char **__src;
  int iVar1;
  char **__dest;
  char *pcVar2;
  size_t __n;
  
  iVar1 = kwsysSystem__AppendByte(arg_local,arg_begin,arg_end,arg_size,'\0');
  if (iVar1 == 0) {
    return 0;
  }
  __src = *begin;
  __n = (long)*end - (long)__src;
  if ((long)__n >> 3 < (long)*size) {
LAB_004d5e6c:
    pcVar2 = (char *)malloc((long)*arg_end - (long)*arg_begin);
    **end = pcVar2;
    iVar1 = 0;
    if (**end != (char *)0x0) {
      memcpy(**end,*arg_begin,(long)*arg_end - (long)*arg_begin);
      *end = *end + 1;
      *arg_end = *arg_begin;
      iVar1 = 1;
    }
  }
  else {
    __dest = (char **)malloc((long)*size << 4);
    if (__dest != (char **)0x0) {
      memcpy(__dest,__src,__n);
      if (__src != local) {
        free(__src);
      }
      *begin = __dest;
      *end = (char **)(__n + (long)__dest);
      *size = *size << 1;
      if (__dest != (char **)0x0) goto LAB_004d5e6c;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int kwsysSystem__AppendArgument(char** local, char*** begin,
                                       char*** end, int* size, char* arg_local,
                                       char** arg_begin, char** arg_end,
                                       int* arg_size)
{
  /* Append a null-terminator to the argument string.  */
  if (!kwsysSystem__AppendByte(arg_local, arg_begin, arg_end, arg_size,
                               '\0')) {
    return 0;
  }

  /* Allocate space for the argument pointer.  */
  if ((*end - *begin) >= *size) {
    kwsysSystem_ptrdiff_t length = *end - *begin;
    char** newPointers = (char**)malloc((size_t)(*size) * 2 * sizeof(char*));
    if (!newPointers) {
      return 0;
    }
    memcpy(newPointers, *begin, (size_t)(length) * sizeof(char*));
    if (*begin != local) {
      free(*begin);
    }
    *begin = newPointers;
    *end = *begin + length;
    *size *= 2;
  }

  /* Allocate space for the argument string.  */
  **end = (char*)malloc((size_t)(*arg_end - *arg_begin));
  if (!**end) {
    return 0;
  }

  /* Store the argument in the command array.  */
  memcpy(**end, *arg_begin, (size_t)(*arg_end - *arg_begin));
  ++(*end);

  /* Reset the argument to be empty.  */
  *arg_end = *arg_begin;

  return 1;
}